

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

size_t __thiscall asmjit::CodeHolder::codeSize(CodeHolder *this)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  lVar3 = 0;
  bVar2 = 0;
  uVar6 = 0;
  do {
    if ((ulong)(this->_sectionsByOrder).super_ZoneVectorBase._size << 3 == lVar3) {
      return -(ulong)bVar2 | uVar6;
    }
    lVar1 = *(long *)((long)(this->_sectionsByOrder).super_ZoneVectorBase._data + lVar3);
    uVar4 = *(ulong *)(lVar1 + 0x50);
    if (*(ulong *)(lVar1 + 0x50) < *(ulong *)(lVar1 + 0x18)) {
      uVar4 = *(ulong *)(lVar1 + 0x18);
    }
    if (uVar4 != 0) {
      uVar5 = -(ulong)*(uint *)(lVar1 + 8) & (uVar6 + *(uint *)(lVar1 + 8)) - 1;
      if (uVar5 < uVar6) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/codeholder.cpp"
                   ,0x378,"alignedOffset >= offset");
      }
      uVar6 = uVar5 + uVar4;
      bVar2 = bVar2 | CARRY8(uVar5,uVar4);
    }
    lVar3 = lVar3 + 8;
  } while( true );
}

Assistant:

size_t CodeHolder::codeSize() const noexcept {
  Support::FastUInt8 of = 0;
  uint64_t offset = 0;

  for (Section* section : _sectionsByOrder) {
    uint64_t realSize = section->realSize();

    if (realSize) {
      uint64_t alignedOffset = Support::alignUp(offset, section->alignment());
      ASMJIT_ASSERT(alignedOffset >= offset);
      offset = Support::addOverflow(alignedOffset, realSize, &of);
    }
  }

  if ((sizeof(uint64_t) > sizeof(size_t) && offset > SIZE_MAX) || of)
    return SIZE_MAX;

  return size_t(offset);
}